

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvode.c
# Opt level: O2

int CVodeSVtolerances(void *cvode_mem,sunrealtype reltol,N_Vector abstol)

{
  undefined8 uVar1;
  int line;
  int error_code;
  char *msgfmt;
  double dVar2;
  
  if (cvode_mem == (void *)0x0) {
    msgfmt = "cvode_mem = NULL illegal.";
    error_code = -0x15;
    cvode_mem = (CVodeMem)0x0;
    line = 0x2d0;
  }
  else if (*(int *)((long)cvode_mem + 0x46c) == 0) {
    msgfmt = "Attempt to call before CVodeInit.";
    error_code = -0x17;
    line = 0x2d7;
  }
  else if (0.0 <= reltol) {
    if (abstol->ops->nvmin == (_func_sunrealtype_N_Vector *)0x0) {
      msgfmt = "Missing N_VMin routine from N_Vector";
      error_code = -0x16;
      line = 0x2e7;
    }
    else {
      dVar2 = (double)N_VMin(abstol);
      if (0.0 <= dVar2) {
        if (*(int *)((long)cvode_mem + 0x468) == 0) {
          uVar1 = N_VClone(*(undefined8 *)((long)cvode_mem + 200));
          *(undefined8 *)((long)cvode_mem + 0x38) = uVar1;
          *(long *)((long)cvode_mem + 0x3c0) =
               *(long *)((long)cvode_mem + 0x3c0) + *(long *)((long)cvode_mem + 0x3b0);
          *(long *)((long)cvode_mem + 0x3c8) =
               *(long *)((long)cvode_mem + 0x3c8) + *(long *)((long)cvode_mem + 0x3b8);
          *(undefined4 *)((long)cvode_mem + 0x468) = 1;
        }
        else {
          uVar1 = *(undefined8 *)((long)cvode_mem + 0x38);
        }
        *(sunrealtype *)((long)cvode_mem + 0x28) = reltol;
        N_VScale(0x3ff0000000000000,abstol,uVar1);
        *(uint *)((long)cvode_mem + 0x40) = -(uint)(dVar2 == 0.0) & 1;
        *(undefined4 *)((long)cvode_mem + 0x24) = 2;
        *(undefined4 *)((long)cvode_mem + 0x44) = 0;
        *(code **)((long)cvode_mem + 0x48) = cvEwtSet;
        *(undefined8 *)((long)cvode_mem + 0x50) = 0;
        return 0;
      }
      msgfmt = "abstol has negative component(s) (illegal).";
      error_code = -0x16;
      line = 0x2ee;
    }
  }
  else {
    msgfmt = "reltol < 0 illegal.";
    error_code = -0x16;
    line = 0x2e0;
  }
  cvProcessError((CVodeMem)cvode_mem,error_code,line,"CVodeSVtolerances",
                 "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/cvode/cvode.c"
                 ,msgfmt);
  return error_code;
}

Assistant:

int CVodeSVtolerances(void* cvode_mem, sunrealtype reltol, N_Vector abstol)
{
  CVodeMem cv_mem;
  sunrealtype atolmin;

  if (cvode_mem == NULL)
  {
    cvProcessError(NULL, CV_MEM_NULL, __LINE__, __func__, __FILE__, MSGCV_NO_MEM);
    return (CV_MEM_NULL);
  }
  cv_mem = (CVodeMem)cvode_mem;

  if (cv_mem->cv_MallocDone == SUNFALSE)
  {
    cvProcessError(cv_mem, CV_NO_MALLOC, __LINE__, __func__, __FILE__,
                   MSGCV_NO_MALLOC);
    return (CV_NO_MALLOC);
  }

  /* Check inputs */

  if (reltol < ZERO)
  {
    cvProcessError(cv_mem, CV_ILL_INPUT, __LINE__, __func__, __FILE__,
                   MSGCV_BAD_RELTOL);
    return (CV_ILL_INPUT);
  }

  if (abstol->ops->nvmin == NULL)
  {
    cvProcessError(cv_mem, CV_ILL_INPUT, __LINE__, __func__, __FILE__,
                   "Missing N_VMin routine from N_Vector");
    return (CV_ILL_INPUT);
  }
  atolmin = N_VMin(abstol);
  if (atolmin < ZERO)
  {
    cvProcessError(cv_mem, CV_ILL_INPUT, __LINE__, __func__, __FILE__,
                   MSGCV_BAD_ABSTOL);
    return (CV_ILL_INPUT);
  }

  /* Copy tolerances into memory */

  if (!(cv_mem->cv_VabstolMallocDone))
  {
    cv_mem->cv_Vabstol = N_VClone(cv_mem->cv_ewt);
    cv_mem->cv_lrw += cv_mem->cv_lrw1;
    cv_mem->cv_liw += cv_mem->cv_liw1;
    cv_mem->cv_VabstolMallocDone = SUNTRUE;
  }

  cv_mem->cv_reltol = reltol;
  N_VScale(ONE, abstol, cv_mem->cv_Vabstol);
  cv_mem->cv_atolmin0 = (atolmin == ZERO);

  cv_mem->cv_itol = CV_SV;

  cv_mem->cv_user_efun = SUNFALSE;
  cv_mem->cv_efun      = cvEwtSet;
  cv_mem->cv_e_data    = NULL; /* will be set to cvode_mem in InitialSetup */

  return (CV_SUCCESS);
}